

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgstrs.c
# Opt level: O2

void sgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  float *pfVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  float *Mxvec;
  float *addr;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  int iVar14;
  ulong uVar15;
  ulong n;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  long local_158;
  int ii;
  
  *info = 0;
  if (trans < (CONJ|TRANS)) {
    uVar1 = L->nrow;
    n = (ulong)uVar1;
    ii = 2;
    iVar17 = -2;
    if ((((-1 < (int)uVar1) && (uVar1 == L->ncol)) && (L->Stype == SLU_SC)) &&
       ((L->Dtype == SLU_S && (L->Mtype == SLU_TRLU)))) {
      ii = 3;
      iVar17 = -3;
      if (((-1 < U->nrow) && ((U->nrow == U->ncol && (U->Stype == SLU_NC)))) &&
         ((U->Dtype == SLU_S && (U->Mtype == SLU_TRU)))) {
        puVar3 = (uint *)B->Store;
        uVar21 = *puVar3;
        uVar18 = (ulong)uVar21;
        ii = 6;
        iVar17 = -6;
        if (((((int)uVar1 <= (int)uVar21) && (B->Stype == SLU_DN)) && (B->Dtype == SLU_S)) &&
           (B->Mtype == SLU_GE)) {
          uVar1 = B->ncol;
          Mxvec = floatCalloc(n * (long)(int)uVar1);
          if (Mxvec == (float *)0x0) {
            sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8c,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c"
                   );
            superlu_abort_and_exit((char *)&ii);
          }
          addr = floatMalloc(n);
          if (addr != (float *)0x0) {
            pfVar4 = *(float **)(puVar3 + 2);
            uVar9 = 0;
            if (0 < (int)uVar1) {
              uVar9 = (ulong)uVar1;
            }
            if (trans == NOTRANS) {
              pvVar5 = L->Store;
              lVar6 = *(long *)((long)pvVar5 + 8);
              pvVar7 = U->Store;
              lVar8 = *(long *)((long)pvVar7 + 8);
              pfVar13 = pfVar4;
              for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  addr[perm_r[uVar15]] = pfVar13[uVar15];
                }
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  pfVar13[uVar15] = addr[uVar15];
                }
                pfVar13 = pfVar13 + uVar18;
              }
              fVar25 = 0.0;
              local_158 = 0;
              while (uVar10 = (ulong)*(int *)((long)pvVar5 + 4), local_158 <= (long)uVar10) {
                lVar23 = (long)*(int *)(*(long *)((long)pvVar5 + 0x30) + local_158 * 4);
                iVar17 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar23 * 4);
                iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar23 * 4);
                iVar16 = iVar2 - iVar17;
                lVar20 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + local_158 * 4) - lVar23;
                iVar14 = (int)lVar20;
                uVar21 = iVar16 - iVar14;
                local_158 = local_158 + 1;
                fVar25 = (float)(int)(uVar1 * 2 * iVar14 * uVar21) +
                         fVar25 + (float)(int)(uVar1 * iVar14 * (iVar14 + -1));
                if (iVar14 == 1) {
                  for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
                    lVar19 = uVar10 * uVar18;
                    pfVar13 = (float *)(lVar6 + 4 +
                                       (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar23 * 4) *
                                       4);
                    lVar20 = (long)iVar17;
                    while (lVar20 = lVar20 + 1, lVar20 < iVar2) {
                      lVar22 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) + lVar20 * 4);
                      pfVar4[lVar19 + lVar22] =
                           pfVar4[lVar19 + lVar22] - pfVar4[lVar19 + lVar23] * *pfVar13;
                      pfVar13 = pfVar13 + 1;
                    }
                  }
                }
                else {
                  lVar19 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar23 * 4);
                  uVar10 = 0;
                  if (0 < (int)uVar21) {
                    uVar10 = (ulong)uVar21;
                  }
                  for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
                    lVar22 = uVar15 * uVar18;
                    slsolve(iVar16,iVar14,(float *)(lVar6 + lVar19 * 4),pfVar4 + lVar22 + lVar23);
                    smatvec(iVar16,uVar21,iVar14,(float *)(lVar6 + (lVar20 + lVar19) * 4),
                            pfVar4 + lVar22 + lVar23,Mxvec);
                    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
                      lVar12 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) +
                                              (long)(iVar17 + iVar14) * 4 + uVar11 * 4);
                      pfVar4[lVar22 + lVar12] = pfVar4[lVar22 + lVar12] - Mxvec[uVar11];
                      Mxvec[uVar11] = 0.0;
                    }
                  }
                }
              }
              for (; -1 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
                iVar17 = *(int *)(*(long *)((long)pvVar5 + 0x30) + (uVar10 & 0xffffffff) * 4);
                lVar23 = (long)iVar17;
                iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + (uVar10 & 0xffffffff) * 4);
                iVar17 = iVar2 - iVar17;
                lVar20 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar23 * 4);
                if (iVar17 == 1) {
                  pfVar13 = pfVar4 + lVar23;
                  uVar15 = uVar9;
                  while (iVar14 = (int)uVar15, uVar15 = (ulong)(iVar14 - 1), iVar14 != 0) {
                    *pfVar13 = *pfVar13 / *(float *)(lVar6 + lVar20 * 4);
                    pfVar13 = pfVar13 + uVar18;
                  }
                }
                else {
                  iVar14 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar23 * 4);
                  iVar16 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar23 * 4);
                  pfVar13 = pfVar4 + lVar23;
                  uVar15 = uVar9;
                  while (bVar24 = uVar15 != 0, uVar15 = uVar15 - 1, bVar24) {
                    susolve(iVar14 - iVar16,iVar17,(float *)(lVar6 + lVar20 * 4),pfVar13);
                    pfVar13 = pfVar13 + uVar18;
                  }
                }
                fVar25 = fVar25 + (float)(int)(uVar1 * iVar17 * (iVar17 + 1));
                for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
                  lVar19 = uVar15 * uVar18;
                  lVar20 = lVar23;
                  while (lVar20 < iVar2) {
                    iVar17 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar20 * 4);
                    iVar14 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar20 * 4);
                    for (lVar22 = (long)iVar14; lVar22 < iVar17; lVar22 = lVar22 + 1) {
                      lVar12 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar22 * 4);
                      pfVar4[lVar19 + lVar12] =
                           pfVar4[lVar19 + lVar12] -
                           pfVar4[lVar19 + lVar20] * *(float *)(lVar8 + lVar22 * 4);
                    }
                    fVar25 = fVar25 + (float)((iVar17 - iVar14) * 2);
                    lVar20 = lVar20 + 1;
                  }
                }
              }
              pfVar13 = pfVar4;
              for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  addr[uVar15] = pfVar4[uVar10 * uVar18 + (long)perm_c[uVar15]];
                }
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  pfVar13[uVar15] = addr[uVar15];
                }
                pfVar13 = pfVar13 + uVar18;
              }
              stat->ops[0x11] = fVar25;
            }
            else {
              pfVar13 = pfVar4;
              for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  addr[perm_c[uVar15]] = pfVar13[uVar15];
                }
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  pfVar13[uVar15] = addr[uVar15];
                }
                pfVar13 = pfVar13 + uVar18;
              }
              stat->ops[0x11] = 0.0;
              pfVar13 = pfVar4;
              uVar10 = uVar9;
              while (bVar24 = uVar10 != 0, uVar10 = uVar10 - 1, bVar24) {
                sp_strsv("U","T","N",L,U,pfVar13,stat,info);
                sp_strsv("L","T","U",L,U,pfVar13,stat,info);
                pfVar13 = pfVar13 + uVar18;
              }
              pfVar13 = pfVar4;
              for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  addr[uVar15] = pfVar4[uVar10 * uVar18 + (long)perm_r[uVar15]];
                }
                for (uVar15 = 0; n != uVar15; uVar15 = uVar15 + 1) {
                  pfVar13[uVar15] = addr[uVar15];
                }
                pfVar13 = pfVar13 + uVar18;
              }
            }
            superlu_free(Mxvec);
            superlu_free(addr);
            return;
          }
          sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8e,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c"
                 );
          superlu_abort_and_exit((char *)&ii);
        }
      }
    }
  }
  else {
    ii = 1;
    iVar17 = -1;
  }
  *info = iVar17;
  input_error("sgstrs",&ii);
  return;
}

Assistant:

void
sgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    float   alpha = 1.0, beta = 1.0;
    float   *work_col;
#endif
    DNformat *Bstore;
    float   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    float   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    float   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void sprint_soln(int n, int nrhs, const float *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_S || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_S || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_S || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("sgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = floatCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = floatMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 2 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			rhs_work[irow] -= rhs_work[fsupc] * Lval[luptr];
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		STRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		SGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		strsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		sgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work_col[i]; /* Scatter */
			work_col[i] = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    slsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    smatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work[i];
			work[i] = 0.0;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    rhs_work[fsupc] /= Lval[luptr];
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		STRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		strsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    susolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			rhs_work[irow] -= rhs_work[jcol] * Uval[i];
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
	for (k = 0; k < nrhs; ++k) {
	    
	    /* Multiply by inv(U'). */
	    sp_strsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	    /* Multiply by inv(L'). */
	    sp_strsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	}
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}